

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GetTempRange(Parse *pParse,int nReg)

{
  int local_20;
  int n;
  int i;
  int nReg_local;
  Parse *pParse_local;
  
  if (nReg == 1) {
    pParse_local._4_4_ = sqlite3GetTempReg(pParse);
  }
  else {
    local_20 = pParse->iRangeReg;
    if (pParse->nRangeReg < nReg) {
      local_20 = pParse->nMem + 1;
      pParse->nMem = nReg + pParse->nMem;
    }
    else {
      pParse->iRangeReg = nReg + pParse->iRangeReg;
      pParse->nRangeReg = pParse->nRangeReg - nReg;
    }
    pParse_local._4_4_ = local_20;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetTempRange(Parse *pParse, int nReg){
  int i, n;
  if( nReg==1 ) return sqlite3GetTempReg(pParse);
  i = pParse->iRangeReg;
  n = pParse->nRangeReg;
  if( nReg<=n ){
    pParse->iRangeReg += nReg;
    pParse->nRangeReg -= nReg;
  }else{
    i = pParse->nMem+1;
    pParse->nMem += nReg;
  }
  return i;
}